

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O2

void __thiscall
nuraft::snapshot_sync_ctx::snapshot_sync_ctx
          (snapshot_sync_ctx *this,ptr<snapshot> *s,int peer_id,ulong timeout_ms,ulong offset)

{
  this->peer_id_ = peer_id;
  std::__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>,
             &s->super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>);
  (this->field_2).offset_ = offset;
  this->user_snp_ctx_ = (void *)0x0;
  timer_helper::timer_helper(&this->timer_,0,false);
  timer_helper::set_duration_ms(&this->timer_,timeout_ms);
  return;
}

Assistant:

snapshot_sync_ctx::snapshot_sync_ctx(const ptr<snapshot>& s,
                                     int peer_id,
                                     ulong timeout_ms,
                                     ulong offset)
    : peer_id_(peer_id)
    , snapshot_(s)
    , offset_(offset)
    , user_snp_ctx_(nullptr)
{
    // 10 seconds by default.
    timer_.set_duration_ms(timeout_ms);
}